

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.h
# Opt level: O3

void __thiscall HighsLpRelaxation::setIterationLimit(HighsLpRelaxation *this,HighsInt limit)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"simplex_iteration_limit","");
  Highs::setOptionValue(&this->lpsolver,&local_40,limit);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void setIterationLimit(HighsInt limit = kHighsIInf) {
    lpsolver.setOptionValue("simplex_iteration_limit", limit);
  }